

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_char_iterator_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::StringCharIteratorTest_test_next3_Test::
~StringCharIteratorTest_test_next3_Test(StringCharIteratorTest_test_next3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StringCharIteratorTest, test_next3)
{
    StringCharIterator tok = StringCharIterator("111,", ',');
    ASSERT_STREQ("111", tok.Next().c_str());
    ASSERT_STREQ("", tok.Next().c_str());

    try
    {
        ASSERT_STREQ("", tok.Next().c_str());
        FAIL();
    }
    catch (std::exception& e)
    {
    }
}